

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<Vehicle,Vehicle>
          (String *__return_storage_ptr__,detail *this,Vehicle *lhs,char *op,Vehicle *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = getTlsOss();
  ::operator<<(poVar1,(Vehicle *)this);
  getTlsOssResult();
  String::String(&local_68,(char *)lhs);
  String::operator+(&local_38,&local_50,&local_68);
  poVar1 = getTlsOss();
  ::operator<<(poVar1,(Vehicle *)op);
  getTlsOssResult();
  String::operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }